

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall antlr::Parser::reportError(Parser *this,string *s)

{
  char *pcVar1;
  long *plVar2;
  int iVar3;
  size_t sVar4;
  long *local_48 [2];
  long local_38 [2];
  
  (*this->_vptr_Parser[8])(local_48,this);
  iVar3 = std::__cxx11::string::compare((char *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (iVar3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: ",7);
    pcVar1 = (s->_M_dataplus)._M_p;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x3066c0);
    }
    else {
      sVar4 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
  }
  else {
    (*this->_vptr_Parser[8])(local_48,this);
    plVar2 = local_48[0];
    if (local_48[0] == (long *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x3066c0);
    }
    else {
      sVar4 = strlen((char *)local_48[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,(char *)plVar2,sVar4)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": error: ",9);
    pcVar1 = (s->_M_dataplus)._M_p;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x3066c0);
    }
    else {
      sVar4 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  return;
}

Assistant:

void Parser::reportError(const ANTLR_USE_NAMESPACE(std)string& s)
{
	if ( getFilename()=="" )
		ANTLR_USE_NAMESPACE(std)cerr << "error: " << s.c_str() << ANTLR_USE_NAMESPACE(std)endl;
	else
		ANTLR_USE_NAMESPACE(std)cerr << getFilename().c_str() << ": error: " << s.c_str() << ANTLR_USE_NAMESPACE(std)endl;
}